

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O0

void __thiscall Catch::Runner::Runner(Runner *this,Ptr<Catch::Config> *config)

{
  long in_RDI;
  Runner *in_stack_000001b0;
  Runner *in_stack_00000200;
  Ptr<Catch::Config> *in_stack_ffffffffffffffb8;
  Ptr<Catch::Config> *in_stack_ffffffffffffffc0;
  
  Ptr<Catch::Config>::Ptr(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::ofstream::ofstream((void *)(in_RDI + 8));
  Ptr<Catch::IStreamingReporter>::Ptr((Ptr<Catch::IStreamingReporter> *)(in_RDI + 0x208));
  std::set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>::set
            ((set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_> *)
             0x1a169c);
  openStream(in_stack_000001b0);
  makeReporter(in_stack_00000200);
  return;
}

Assistant:

Runner( Ptr<Config> const& config )
        :   m_config( config )
        {
            openStream();
            makeReporter();
        }